

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void biffob(bifcxdef *ctx,int argc)

{
  voccxdef *voc;
  runsdef *prVar1;
  vocidef **ppvVar2;
  vocidef *v;
  short sVar3;
  int iVar4;
  vocidef ***pppvVar5;
  int iVar6;
  long lVar7;
  objnum cls;
  runcxdef *local_48;
  
  local_48 = ctx->bifcxrun;
  voc = local_48->runcxvoc;
  cls = 0xffff;
  if (argc != 0) {
    if (argc != 1) {
      local_48->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x401);
    }
    prVar1 = local_48->runcxsp;
    local_48->runcxsp = prVar1 + -1;
    local_48 = ctx->bifcxrun;
    if (prVar1[-1].runstyp != '\x02') {
      local_48->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3f2);
    }
    cls = (local_48->runcxsp->runsv).runsvobj;
  }
  pppvVar5 = voc->voccxinh;
  sVar3 = 0;
  iVar6 = 0;
  do {
    if (iVar6 == 0x80) {
      runpnil(local_48);
      return;
    }
    ppvVar2 = *pppvVar5;
    if (ppvVar2 != (vocidef **)0x0) {
      for (lVar7 = 0; (int)lVar7 != 0x100; lVar7 = lVar7 + 1) {
        v = ppvVar2[lVar7];
        if (((v != (vocidef *)0x0) && (((v->vociu).vocius.vociusflg & 1) == 0)) &&
           ((cls == 0xffff || (iVar4 = bifinh(voc,v,cls), iVar4 != 0)))) {
          runpobj(local_48,(short)lVar7 - sVar3);
          return;
        }
      }
    }
    pppvVar5 = pppvVar5 + 1;
    iVar6 = iVar6 + 1;
    sVar3 = sVar3 + -0x100;
  } while( true );
}

Assistant:

void biffob(bifcxdef *ctx, int argc)
{
    vocidef ***vpg;
    vocidef  **v;
    objnum     obj;
    int        i;
    int        j;
    objnum     cls;
    voccxdef  *voc = ctx->bifcxrun->runcxvoc;

    /* get class to search for, if one is specified */
    if (argc == 0)
        cls = MCMONINV;
    else if (argc == 1)
        cls = runpopobj(ctx->bifcxrun);
    else
        runsig(ctx->bifcxrun, ERR_BIFARGC);
    
    for (vpg = voc->voccxinh, i = 0 ; i < VOCINHMAX ; ++vpg, ++i)
    {
        if (!*vpg) continue;
        for (v = *vpg, obj = (i << 8), j = 0 ; j < 256 ; ++v, ++obj, ++j)
        {
            if (!*v || ((*v)->vociflg & VOCIFCLASS)
                || (cls != MCMONINV && !bifinh(voc, *v, cls)))
                continue;
            
            /* this is an object we can use - push it */
            runpobj(ctx->bifcxrun, obj);
            return;
        }
    }
    
    /* no objects found at all - return nil */
    runpnil(ctx->bifcxrun);
}